

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexicalCast.h
# Opt level: O0

enable_if_t<std::is_arithmetic<int>::value,_bool> __thiscall
beast::detail::LexicalCast<std::__cxx11::string,int>::operator()(void *this,string *out,int in)

{
  string local_40;
  int local_1c;
  string *psStack_18;
  int in_local;
  string *out_local;
  LexicalCast<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *this_local;
  
  local_1c = in;
  psStack_18 = out;
  out_local = (string *)this;
  std::__cxx11::to_string(&local_40,in);
  std::__cxx11::string::operator=((string *)psStack_18,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return true;
}

Assistant:

std::enable_if_t <std::is_arithmetic <Arithmetic>::value, bool>
    operator () (std::string& out, Arithmetic in)
    {
        out = std::to_string (in);
        return true;
    }